

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix __thiscall Matrix::GenerateMatrix(Matrix *this,int n,int param)

{
  double *pdVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  double dVar3;
  double __b;
  result_type_conflict rVar4;
  Matrix MVar5;
  result_type_conflict generated;
  int j;
  int i;
  uniform_real_distribution<double> distr;
  undefined1 local_13a8 [8];
  random_device device;
  int param_local;
  int n_local;
  Matrix *m;
  
  device.field_0.field2[4999] = 0;
  Matrix(this,n,n);
  std::random_device::random_device((random_device *)local_13a8);
  dVar3 = pow(2.0,(double)param * 0.25);
  __b = pow(2.0,(double)param * 0.25);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)&j,-dVar3,__b);
  for (generated._4_4_ = 0; generated._4_4_ < n; generated._4_4_ = generated._4_4_ + 1) {
    for (generated._0_4_ = 0; generated._0_4_ < n; generated._0_4_ = generated._0_4_ + 1) {
      rVar4 = std::uniform_real_distribution<double>::operator()
                        ((uniform_real_distribution<double> *)&j,(random_device *)local_13a8);
      pdVar1 = operator()(this,generated._4_4_,generated._0_4_);
      *pdVar1 = rVar4;
    }
  }
  device.field_0.field2[4999] = 1;
  std::random_device::~random_device((random_device *)local_13a8);
  uVar2 = extraout_RDX;
  if ((device.field_0.field2[4999] & 1) == 0) {
    ~Matrix(this);
    uVar2 = extraout_RDX_00;
  }
  MVar5.rows = (int)uVar2;
  MVar5.cols = (int)((ulong)uVar2 >> 0x20);
  MVar5.data = (double *)this;
  return MVar5;
}

Assistant:

Matrix Matrix::GenerateMatrix(int n, int param)
{
    Matrix m(n, n);

    std::random_device device;
    std::uniform_real_distribution<double> distr(
        -pow(2, static_cast<double>(param) / 4),
        pow(2, static_cast<double>(param) / 4)
    );

    for (int i = 0; i < n; ++i)
    {
        for (int j = 0; j < n; j++)
        {
            const auto generated = distr(device);
            m(i, j) = generated;
        }
    }

    return m;
}